

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructSerializer.hpp
# Opt level: O3

void mserialize::
     StructSerializer<binlog::EventSource,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::id>,_std::integral_constant<binlog::Severity_binlog::EventSource::*,_&binlog::EventSource::severity>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::category>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::function>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::file>,_std::integral_constant<unsigned_long_binlog::EventSource::*,_&binlog::EventSource::line>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::formatString>,_std::integral_constant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_binlog::EventSource::*,_&binlog::EventSource::argumentTags>_>
     ::serialize<binlog::detail::RecoverableVectorOutputStream>
               (EventSource *t,RecoverableVectorOutputStream *ostream)

{
  size_t in_RCX;
  uint64_t local_20;
  
  local_20 = t->id;
  binlog::detail::RecoverableVectorOutputStream::write(ostream,(int)&local_20,(void *)0x8,in_RCX);
  local_20 = CONCAT62(local_20._2_6_,t->severity);
  binlog::detail::RecoverableVectorOutputStream::write(ostream,(int)&local_20,(void *)0x2,in_RCX);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(&t->category,ostream);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(&t->function,ostream);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(&t->file,ostream);
  local_20 = t->line;
  binlog::detail::RecoverableVectorOutputStream::write(ostream,(int)&local_20,(void *)0x8,in_RCX);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(&t->formatString,ostream);
  detail::
  BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::serialize<binlog::detail::RecoverableVectorOutputStream>(&t->argumentTags,ostream);
  return;
}

Assistant:

static void serialize(const T& t, OutputStream& ostream)
  {
    using swallow = int[];
    (void)swallow{1, (serialize_member(t, Members::value, ostream), int{})...};
  }